

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array2d_kernel.h
# Opt level: O2

void __thiscall
dlib::array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>::clear
          (array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_> *this)

{
  if (this->data != (rgb_alpha_pixel *)0x0) {
    operator_delete__(this->data);
    this->nr_ = 0;
    this->data = (rgb_alpha_pixel *)0x0;
    this->nc_ = 0;
    this->at_start_ = true;
    this->cur = (rgb_alpha_pixel *)0x0;
    this->last = (rgb_alpha_pixel *)0x0;
  }
  return;
}

Assistant:

void clear (
        )
        {
            if (data != 0)
            {
                pool.deallocate_array(data);
                nc_ = 0;
                nr_ = 0;
                data = 0;
                at_start_ = true;
                cur = 0;
                last = 0;
            }
        }